

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_set_hs_ecjpake_password(mbedtls_ssl_context *ssl,uchar *pw,size_t pw_len)

{
  int iVar1;
  
  if (((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) &&
      (ssl->conf != (mbedtls_ssl_config *)0x0)) && (pw_len != 0 && pw != (uchar *)0x0)) {
    iVar1 = mbedtls_ecjpake_setup
                      (&ssl->handshake->ecjpake_ctx,(uint)(ssl->conf->endpoint == '\x01'),
                       MBEDTLS_MD_SHA256,MBEDTLS_ECP_DP_SECP256R1,pw,pw_len);
    return iVar1;
  }
  return -0x7100;
}

Assistant:

int mbedtls_ssl_set_hs_ecjpake_password(mbedtls_ssl_context *ssl,
                                        const unsigned char *pw,
                                        size_t pw_len)
{
    mbedtls_ecjpake_role role;

    if (ssl->handshake == NULL || ssl->conf == NULL) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    /* Empty password is not valid  */
    if ((pw == NULL) || (pw_len == 0)) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER) {
        role = MBEDTLS_ECJPAKE_SERVER;
    } else {
        role = MBEDTLS_ECJPAKE_CLIENT;
    }

    return mbedtls_ecjpake_setup(&ssl->handshake->ecjpake_ctx,
                                 role,
                                 MBEDTLS_MD_SHA256,
                                 MBEDTLS_ECP_DP_SECP256R1,
                                 pw, pw_len);
}